

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

QRect __thiscall
QTreeViewPrivate::intersectedRect
          (QTreeViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar3;
  int iVar4;
  Representation RVar5;
  char cVar6;
  bool bVar7;
  Representation RVar8;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar9;
  int iVar10;
  Representation RVar11;
  int logicalIndex;
  long in_FS_OFFSET;
  Bucket BVar12;
  QRect QVar13;
  undefined1 local_d8 [16];
  QRect local_c8;
  QModelIndex local_b8;
  QRect local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QRect local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_68._8_8_ = rect._8_8_;
  local_68._0_8_ = rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (topLeft->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_88 = (undefined1 *)0xffffffffffffffff;
    puStack_80 = (undefined1 *)0x0;
    local_78 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_88,pQVar1,topLeft);
  }
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  local_98 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  if (topLeft->r <= bottomRight->r) {
    iVar4 = -0x80000000;
    RVar11.m_i = 0x7fffffff;
    iVar10 = topLeft->r;
    local_98 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    do {
      local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.r = -0x55555556;
      local_b8.c = -0x55555556;
      local_b8.i._0_4_ = 0xaaaaaaaa;
      local_b8.i._4_4_ = 0xaaaaaaaa;
      pQVar1 = (this->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_b8,pQVar1,iVar10,0,&local_88);
      pDVar2 = (this->hiddenIndexes).q_hash.d;
      if ((pDVar2 == (Data *)0x0) || (pDVar2->size == 0)) {
LAB_005a0713:
        local_c8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
        RVar5.m_i = iVar4;
        if (RVar11.m_i == 0x7fffffff) {
          pDVar2 = (this->spanningIndexes).q_hash.d;
          if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_58,&local_b8);
            pDVar3 = (this->spanningIndexes).q_hash.d;
            if (pDVar3 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
            {
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
            }
            else {
              pNVar9 = QHashPrivate::
                       Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                       findNode<QPersistentModelIndex>(pDVar3,(QPersistentModelIndex *)&local_58);
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
              if (pNVar9 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) {
                local_c8 = visualRect(this,&local_b8,FullRow);
                cVar6 = QRect::intersects(&local_c8);
                RVar11.m_i = 0x7fffffff;
                if (cVar6 != '\0') goto LAB_005a0956;
                goto LAB_005a0996;
              }
            }
          }
          logicalIndex = topLeft->c;
          if (topLeft->c <= bottomRight->c) {
            do {
              bVar7 = QHeaderView::isSectionHidden(this->header,logicalIndex);
              if (!bVar7) {
                local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_58 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                pQVar1 = (this->super_QAbstractItemViewPrivate).model;
                (**(code **)(*(long *)pQVar1 + 0x60))
                          ((QModelIndex *)&local_58,pQVar1,iVar10,logicalIndex,&local_88);
                local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_d8 = (undefined1  [16])visualRect(this,(QModelIndex *)&local_58,SingleSection)
                ;
                if (local_d8._4_4_ + -1 != local_d8._12_4_ || local_d8._8_4_ != local_d8._0_4_ + -1)
                {
                  if ((local_68.y2.m_i < local_d8._4_4_) || (local_d8._12_4_ < local_68.y1.m_i))
                  break;
                  cVar6 = QRect::intersects((QRect *)local_d8);
                  if (cVar6 != '\0') {
                    local_c8 = (QRect)QRect::operator|(&local_c8,(QRect *)local_d8);
                    if ((local_c8.x1.m_i.m_i < local_68.x1.m_i) &&
                       (local_68.x2.m_i < local_c8.x2.m_i.m_i)) break;
                  }
                }
              }
              bVar7 = logicalIndex < bottomRight->c;
              logicalIndex = logicalIndex + 1;
            } while (bVar7);
          }
          if (local_c8.x1.m_i <= local_c8.x2.m_i) {
            if (local_c8.y1.m_i <= local_c8.y2.m_i) {
              RVar11.m_i = local_c8.x1.m_i;
              RVar5.m_i = local_c8.x2.m_i;
              if (local_c8.x2.m_i < iVar4) {
                RVar5.m_i = iVar4;
              }
              goto LAB_005a0956;
            }
          }
          RVar11.m_i = 0x7fffffff;
        }
        else {
          local_c8 = visualRect(this,&local_b8,FullRow);
          cVar6 = QRect::intersects(&local_c8);
          if (cVar6 == '\0') goto LAB_005a0996;
          RVar8.m_i = local_c8.y1.m_i + -1 + local_c8.y2.m_i;
          local_c8.x1.m_i = RVar11.m_i;
          local_c8.x2.m_i = iVar4 + RVar11.m_i + -1;
          local_c8.y2.m_i = RVar8.m_i;
        }
LAB_005a0956:
        QVar13 = (QRect)QRect::operator|(&local_98,&local_c8);
        local_98 = QVar13;
        cVar6 = QRect::contains(&local_98,SUB81(&local_68,0));
        iVar4 = RVar5.m_i;
        if (cVar6 != '\0') break;
      }
      else {
        local_48.ptr = local_b8.m.ptr;
        local_58 = (undefined1 *)CONCAT44(local_b8.c,local_b8.r);
        puStack_50 = (undefined1 *)CONCAT44(local_b8.i._4_4_,(undefined4)local_b8.i);
        this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                    **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
        if (this_00 ==
            (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
             *)0x0) goto LAB_005a0713;
        BVar12 = QHashPrivate::
                 Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 ::findBucket<QtPrivate::QModelIndexWrapper>
                           (this_00,(QModelIndexWrapper *)&local_58);
        if ((BVar12.span[BVar12.index] == (Span)0xff) || (*(long *)(BVar12.span + 0x80) == 0))
        goto LAB_005a0713;
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,&local_b8);
        pDVar3 = (this->hiddenIndexes).q_hash.d;
        if (pDVar3 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
          goto LAB_005a0713;
        }
        pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                 findNode<QPersistentModelIndex>(pDVar3,(QPersistentModelIndex *)&local_58);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
        if (pNVar9 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_005a0713;
      }
LAB_005a0996:
      bVar7 = iVar10 < bottomRight->r;
      iVar10 = iVar10 + 1;
    } while (bVar7);
  }
  QVar13 = (QRect)QRect::operator&(&local_68,&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar13;
}

Assistant:

QRect QTreeViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    const auto parentIdx = topLeft.parent();
    executePostedLayout();
    QRect updateRect;
    int left = std::numeric_limits<int>::max();
    int right = std::numeric_limits<int>::min();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        const auto idxCol0 = model->index(row, 0, parentIdx);
        if (isRowHidden(idxCol0))
            continue;
        QRect rowRect;
        if (left != std::numeric_limits<int>::max()) {
            // we already know left and right boundary of the rect to update
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
            rowRect = QRect(left, rowRect.top(), right, rowRect.bottom());
        } else if (!spanningIndexes.isEmpty() && spanningIndexes.contains(idxCol0)) {
            // isFirstColumnSpanned re-creates the child index so take a shortcut here
            // spans the whole row, therefore ask for FullRow instead for every cell
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
        } else {
            for (int col = topLeft.column(); col <= bottomRight.column(); ++col) {
                if (header->isSectionHidden(col))
                    continue;
                const QModelIndex idx(model->index(row, col, parentIdx));
                const QRect idxRect = visualRect(idx, SingleSection);
                if (idxRect.isNull())
                    continue;
                // early exit when complete row is out of viewport
                if (idxRect.top() > rect.bottom() || idxRect.bottom() < rect.top())
                    break;
                if (!idxRect.intersects(rect))
                    continue;
                rowRect = rowRect.united(idxRect);
                if (rowRect.left() < rect.left() && rowRect.right() > rect.right())
                    break;
            }
            if (rowRect.isValid()) {
                left = std::min(left, rowRect.left());
                right = std::max(right, rowRect.right());
            }
        }
        updateRect = updateRect.united(rowRect);
        if (updateRect.contains(rect))  // already full rect covered?
            break;
    }
    return rect.intersected(updateRect);
}